

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonBlobMakeEditable(JsonParse *pParse,u32 nExtra)

{
  void *__src;
  int iVar1;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  u32 nSize;
  u8 *aOld;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  if (*(char *)((long)in_RDI + 0x2f) == '\0') {
    if (*(int *)((long)in_RDI + 0xc) == 0) {
      __src = (void *)*in_RDI;
      *in_RDI = 0;
      iVar1 = jsonBlobExpand((JsonParse *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                             (u32)((ulong)__src >> 0x20));
      if (iVar1 == 0) {
        memcpy((void *)*in_RDI,__src,(ulong)*(uint *)(in_RDI + 1));
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int jsonBlobMakeEditable(JsonParse *pParse, u32 nExtra){
  u8 *aOld;
  u32 nSize;
  assert( !pParse->bReadOnly );
  if( pParse->oom ) return 0;
  if( pParse->nBlobAlloc>0 ) return 1;
  aOld = pParse->aBlob;
  nSize = pParse->nBlob + nExtra;
  pParse->aBlob = 0;
  if( jsonBlobExpand(pParse, nSize) ){
    return 0;
  }
  assert( pParse->nBlobAlloc >= pParse->nBlob + nExtra );
  memcpy(pParse->aBlob, aOld, pParse->nBlob);
  return 1;
}